

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTest::GraphTest(GraphTest *this)

{
  GraphTest *this_local;
  
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_00263e90;
  VirtualFileSystem::VirtualFileSystem(&this->fs_);
  DependencyScan::DependencyScan
            (&this->scan_,&(this->super_StateTestWithBuiltinRules).state_,(BuildLog *)0x0,
             (DepsLog *)0x0,&(this->fs_).super_DiskInterface,(DepfileParserOptions *)0x0);
  return;
}

Assistant:

GraphTest() : scan_(&state_, NULL, NULL, &fs_, NULL) {}